

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O0

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::WriteObjGradients
          (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *this)

{
  NLHeader *pNVar1;
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *in_RDI;
  SingleSparseDblVecWrtFactory vwf;
  int i;
  SingleSparseVecWrtFactory<int,_double> *gw;
  undefined4 in_stack_ffffffffffffff68;
  int i_00;
  SingleSparseVecWrtFactory<int,_double> local_68;
  int local_c;
  
  local_c = 0;
  while( true ) {
    i_00 = local_c;
    pNVar1 = Hdr(in_RDI);
    if ((pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_objs <= i_00) break;
    gw = &local_68;
    std::function<void(int)>::
    function<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::WriteObjGradients()::_lambda(int)_1_,void>
              ((function<void_(int)> *)in_RDI,
               (anon_class_16_2_d708298c *)CONCAT44(i_00,in_stack_ffffffffffffff68));
    SingleSparseVecWrtFactory<int,_double>::SingleSparseVecWrtFactory
              ((SingleSparseVecWrtFactory<int,_double> *)in_RDI,
               (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *)
               CONCAT44(i_00,in_stack_ffffffffffffff68),(function<void_(int)> *)gw);
    std::function<void_(int)>::~function((function<void_(int)> *)0x114b25);
    Feeder(in_RDI);
    ExampleNLFeeder::
    FeedObjGradient<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::SingleSparseVecWrtFactory<int,double>>
              ((ExampleNLFeeder *)in_RDI,i_00,gw);
    SingleSparseVecWrtFactory<int,_double>::~SingleSparseVecWrtFactory
              ((SingleSparseVecWrtFactory<int,_double> *)0x114b4f);
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void NLWriter2<Params>::WriteObjGradients() {
  for (int i=0; i<Hdr().num_objs; ++i) {
    SingleSparseDblVecWrtFactory
        vwf(*this,
            [i, this](int nnz){
      this->apr(this->nm, "G%d %d\n", i, nnz);
    });
    Feeder().FeedObjGradient(i, vwf);
  }
}